

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

_Bool handle_options_item(menu_conflict *menu,ui_event *event,wchar_t oid)

{
  wchar_t oid_local;
  ui_event *event_local;
  menu_conflict *menu_local;
  
  if (event->type == EVT_SELECT) {
    if ((uint)oid < 0xf) {
      sval_menu(sval_dependent[oid].tval,sval_dependent[oid].desc);
    }
    else {
      if (2 < (uint)(oid + L'\xfffffff0')) {
        __assert_fail("(size_t) oid < N_ELEMENTS(extra_item_options)",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-options.c"
                      ,0x7be,"_Bool handle_options_item(struct menu *, const ui_event *, int)");
      }
      (*extra_item_options[oid + L'\xfffffff0'].action)((char *)0x0,0);
    }
    menu_local._7_1_ = true;
  }
  else {
    menu_local._7_1_ = false;
  }
  return menu_local._7_1_;
}

Assistant:

static bool handle_options_item(struct menu *menu, const ui_event *event,
								int oid)
{
	if (event->type == EVT_SELECT) {
		if ((size_t) oid < N_ELEMENTS(sval_dependent))
		{
			sval_menu(sval_dependent[oid].tval, sval_dependent[oid].desc);
		} else {
			oid = oid - (int)N_ELEMENTS(sval_dependent) - 1;
			assert((size_t) oid < N_ELEMENTS(extra_item_options));
			extra_item_options[oid].action(NULL, 0);
		}

		return true;
	}

	return false;
}